

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O2

void __thiscall FlowInfo::collectEdges(FlowInfo *this)

{
  _List_node_base **pp_Var1;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *this_00;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *this_01;
  _List_node_base *p_Var2;
  pointer pAVar3;
  _Self __tmp;
  JumpTable *pJVar4;
  LowlevelError *this_02;
  byte bVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  long lVar11;
  PcodeOp *targ_op;
  allocator local_69;
  _List_node_base *local_68;
  PcodeOp *op;
  _List_node_base *local_58;
  string local_50;
  
  if ((int)((ulong)((long)(this->bblocks->list).
                          super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->bblocks->list).
                         super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    this_02 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string((string *)&local_50,"Basic blocks already calculated\n",&local_69);
    LowlevelError::LowlevelError(this_02,&local_50);
    __cxa_throw(this_02,&RecovError::typeinfo,LowlevelError::~LowlevelError);
  }
  local_58 = (_List_node_base *)&this->obank->deadlist;
  this_00 = &this->block_edge1;
  this_01 = &this->block_edge2;
  local_68 = (this->obank->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl
             ._M_node.super__List_node_base._M_next;
  p_Var10 = local_58;
switchD_002c407f_caseD_a:
  if (local_68 == p_Var10) {
    return;
  }
  p_Var2 = local_68->_M_next;
  op = (PcodeOp *)local_68[1]._M_next;
  if (p_Var2 == p_Var10) {
    bVar5 = 1;
  }
  else {
    bVar5 = *(byte *)&(p_Var2[1]._M_next)->_M_prev & 1;
  }
  local_68 = p_Var2;
  switch(op->opcode->opcode) {
  case CPUI_BRANCH:
    targ_op = branchTarget(this,op);
    break;
  case CPUI_CBRANCH:
    targ_op = fallthruOp(this,op);
    std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(this_00,&op);
    std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(this_01,&targ_op);
    targ_op = branchTarget(this,op);
    break;
  case CPUI_BRANCHIND:
    pJVar4 = Funcdata::findJumpTable(this->data,op);
    if (pJVar4 != (JumpTable *)0x0) {
      uVar8 = (ulong)((long)(pJVar4->addresstable).
                            super__Vector_base<Address,_std::allocator<Address>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pJVar4->addresstable).
                           super__Vector_base<Address,_std::allocator<Address>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 4;
      uVar9 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      for (lVar11 = 0; uVar9 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        pAVar3 = (pJVar4->addresstable).super__Vector_base<Address,_std::allocator<Address>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_50._M_dataplus._M_p = *(pointer *)((long)&pAVar3->base + lVar11);
        local_50._M_string_length = *(size_type *)((long)&pAVar3->offset + lVar11);
        targ_op = target(this,(Address *)&local_50);
        if ((targ_op->flags >> 0xd & 1) == 0) {
          targ_op->flags = targ_op->flags | 0x2000;
          std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(this_00,&op);
          std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(this_01,&targ_op);
        }
      }
      p_Var2 = (this_00->super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      p_Var6 = (_List_node_base *)this_01;
      p_Var7 = (_List_node_base *)this_00;
      while ((p_Var10 = local_58, p_Var7 != p_Var2 &&
             (p_Var7 = p_Var7->_M_prev, (PcodeOp *)p_Var7[1]._M_next == op))) {
        p_Var6 = p_Var6->_M_prev;
        pp_Var1 = &(p_Var6[1]._M_next)->_M_prev;
        *(uint *)pp_Var1 = *(uint *)pp_Var1 & 0xffffdfff;
      }
    }
    goto switchD_002c407f_caseD_a;
  default:
    if (bVar5 == 0) goto switchD_002c407f_caseD_a;
    targ_op = fallthruOp(this,op);
    break;
  case CPUI_RETURN:
    goto switchD_002c407f_caseD_a;
  }
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(this_00,&op);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(this_01,&targ_op);
  goto switchD_002c407f_caseD_a;
}

Assistant:

void FlowInfo::collectEdges(void)

{
  list<PcodeOp *>::const_iterator iter,iterend,iter1,iter2;
  PcodeOp *op,*targ_op;
  JumpTable *jt;
  bool nextstart;
  int4 i,num;

  if (bblocks.getSize() != 0)
    throw RecovError("Basic blocks already calculated\n");

  iter = obank.beginDead();
  iterend = obank.endDead();
  while(iter!=iterend) {
    op = *iter++;
    if (iter==iterend)
      nextstart = true;
    else
      nextstart = (*iter)->isBlockStart();
    switch(op->code()) {
    case CPUI_BRANCH:
      targ_op = branchTarget(op);
      block_edge1.push_back(op);
      //      block_edge2.push_back(op->Input(0)->getAddr().Iop());
      block_edge2.push_back(targ_op);
      break;
    case CPUI_BRANCHIND:
      jt = data.findJumpTable(op);
      if (jt == (JumpTable *)0) break;
				// If we are in this routine and there is no table
				// Then we must be doing partial flow analysis
				// so assume there are no branches out
      num = jt->numEntries();
      for(i=0;i<num;++i) {
	targ_op = target(jt->getAddressByIndex(i));
	if (targ_op->isMark()) continue; // Already a link between these blocks
	targ_op->setMark();
	block_edge1.push_back(op);
	block_edge2.push_back(targ_op);
      }
      iter1 = block_edge1.end(); // Clean up our marks
      iter2 = block_edge2.end();
      while(iter1 != block_edge1.begin()) {
	--iter1;
	--iter2;
	if ((*iter1)==op)
	  (*iter2)->clearMark();
	else
	  break;
      }
      break;
    case CPUI_RETURN:
      break;
    case CPUI_CBRANCH:
      targ_op = fallthruOp(op); // Put in fallthru edge
      block_edge1.push_back(op);
      block_edge2.push_back(targ_op);
      targ_op = branchTarget(op);
      block_edge1.push_back(op);
      block_edge2.push_back(targ_op);
      break;
    default:
      if (nextstart) {		// Put in fallthru edge if new basic block
	targ_op = fallthruOp(op);
	block_edge1.push_back(op);
	block_edge2.push_back(targ_op);
      }
      break;
    }
  }
}